

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestMemoryOutStream.cpp
# Opt level: O3

void __thiscall
anon_unknown.dwarf_29121::TestStreamingMultipleTimesConcatenatesResult::RunImpl
          (TestStreamingMultipleTimesConcatenatesResult *this)

{
  TestResults *results;
  TestResults **ppTVar1;
  char *actual;
  TestDetails **ppTVar2;
  MemoryOutStream stream;
  TestDetails TStack_1c8;
  undefined1 local_1a8 [408];
  
  UnitTest::MemoryOutStream::MemoryOutStream((MemoryOutStream *)local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"Bork",4);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"Foo",3);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"Bar",3);
  ppTVar1 = UnitTest::CurrentTest::Results();
  results = *ppTVar1;
  actual = UnitTest::MemoryOutStream::GetText((MemoryOutStream *)local_1a8);
  ppTVar2 = UnitTest::CurrentTest::Details();
  UnitTest::TestDetails::TestDetails(&TStack_1c8,*ppTVar2,0x1d);
  UnitTest::CheckEqual(results,"BorkFooBar",actual,&TStack_1c8);
  UnitTest::MemoryOutStream::~MemoryOutStream
            ((MemoryOutStream *)local_1a8,&UnitTest::MemoryOutStream::VTT);
  std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x90));
  return;
}

Assistant:

TEST(StreamingMultipleTimesConcatenatesResult)
{
    MemoryOutStream stream;
    stream << "Bork" << "Foo" << "Bar";
    CHECK_EQUAL("BorkFooBar", stream.GetText());
}